

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O0

size_t __thiscall
xemmai::t_context::f_tail<&xemmai::t_type_of<xemmai::t_object>::f_subtract>
          (t_context *this,t_object *a_this)

{
  t_pvalue *ptVar1;
  t_lambda *ptVar2;
  t_value<xemmai::t_pointer> *__first;
  t_type *ptVar3;
  size_t sVar4;
  t_value<xemmai::t_pointer> **pptVar5;
  size_t n;
  t_pvalue *stack;
  t_object *a_this_local;
  t_context *this_local;
  t_pvalue *local_28;
  size_t local_20;
  t_value<xemmai::t_pointer> *local_18;
  t_context *local_10;
  
  ptVar1 = this->v_base;
  ptVar2 = t_object::f_as<xemmai::t_lambda>(this->v_lambda);
  __first = ptVar1 + ptVar2->v_privates;
  ptVar3 = t_object::f_type(a_this);
  sVar4 = (*ptVar3->f_subtract)(a_this,__first);
  if (sVar4 == 0xffffffffffffffff) {
    t_value<xemmai::t_pointer>::operator=(this->v_base + -2,__first);
    f_stack__(this->v_previous);
  }
  else {
    local_20 = sVar4;
    local_18 = __first;
    local_10 = this;
    std::copy<xemmai::t_value<xemmai::t_pointer>*,xemmai::t_value<xemmai::t_pointer>*>
              (__first,__first + sVar4 + 2,this->v_base + -2);
    local_28 = this->v_base + local_20;
    pptVar5 = std::max<xemmai::t_value<xemmai::t_pointer>*>(&this->v_previous,&local_28);
    f_stack__(*pptVar5);
  }
  return sVar4;
}

Assistant:

size_t t_context::f_tail(t_object* a_this)
{
	auto stack = v_base + v_lambda->f_as<t_lambda>().v_privates;
	size_t n = (a_this->f_type()->*A_function)(a_this, stack);
	if (n == size_t(-1))
		f_return(stack[0]);
	else
		f_tail(stack, n);
	return n;
}